

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

CURLcode Curl_is_connected(connectdata *conn,int sockindex,_Bool *connected)

{
  undefined8 uVar1;
  int iVar2;
  _Bool _Var3;
  uint uVar4;
  CURLcode CVar5;
  CURLcode CVar6;
  CURLcode CVar7;
  long lVar8;
  int *piVar9;
  char *pcVar10;
  SessionHandle *pSVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  int error;
  char ipaddress [46];
  int local_b0;
  CURLcode local_ac;
  int local_a8;
  CURLcode local_a4;
  long local_a0;
  uint local_94;
  timeval local_90;
  _Bool *local_80;
  SessionHandle *local_78;
  ulong local_70;
  char local_68 [56];
  
  pSVar11 = conn->data;
  local_b0 = 0;
  *connected = false;
  local_a0 = (long)sockindex;
  if ((conn->bits).tcpconnect[local_a0] == true) {
    *connected = true;
    CVar5 = CURLE_OK;
  }
  else {
    local_90 = curlx_tvnow();
    local_70 = Curl_timeleft(pSVar11,&local_90,true);
    if ((long)local_70 < 0) {
      Curl_failf(pSVar11,"Connection time-out");
      CVar5 = CURLE_OPERATION_TIMEDOUT;
    }
    else {
      lVar13 = -1;
      local_ac = CURLE_OK;
      local_a8 = sockindex;
      local_80 = connected;
      local_78 = pSVar11;
      do {
        if (conn->tempsock[lVar13 + 1] == -1) {
          iVar15 = 6;
          CVar5 = local_ac;
          CVar7 = local_a4;
        }
        else {
          uVar12 = (int)lVar13 + 1U ^ 1;
          uVar4 = Curl_socket_check(-1,-1,conn->tempsock[lVar13 + 1],0);
          if (uVar4 == 2) {
            _Var3 = verifyconnect(conn->tempsock[lVar13 + 1],&local_b0);
            if (_Var3) {
              conn->sock[local_a0] = conn->tempsock[lVar13 + 1];
              conn->ip_addr = conn->tempaddr[lVar13 + 1];
              conn->tempsock[lVar13 + 1] = -1;
              if (conn->tempsock[uVar12] != -1) {
                Curl_closesocket(conn,conn->tempsock[uVar12]);
                conn->tempsock[uVar12] = -1;
              }
              iVar2 = local_a8;
              CVar5 = Curl_connected_proxy(conn,local_a8);
              iVar15 = 1;
              CVar7 = CVar5;
              if (CVar5 == CURLE_OK) {
                (conn->bits).tcpconnect[local_a0] = true;
                *local_80 = true;
                if (iVar2 == 0) {
                  Curl_pgrsTime(pSVar11,TIMER_CONNECT);
                }
                Curl_updateconninfo(conn,conn->sock[local_a0]);
                Curl_verboseconnect(conn);
                local_ac = CURLE_OK;
                local_a4 = CURLE_OK;
                CVar5 = local_ac;
                CVar7 = local_a4;
              }
              goto LAB_004bf43c;
            }
            Curl_infof(pSVar11,"Connection failed\n");
          }
          else if (uVar4 == 0) {
            lVar8 = curlx_tvdiff(local_90,conn->connecttime);
            if (conn->timeoutms_per_addr <= lVar8) {
              Curl_infof(pSVar11,"After %ldms connect time, move on!\n");
              local_b0 = 0x6e;
            }
            if (((lVar13 == -1) && (conn->tempaddr[1] == (Curl_addrinfo *)0x0)) &&
               (lVar8 = curlx_tvdiff(local_90,conn->connecttime), 199 < lVar8)) {
              trynextip(conn,local_a8,1);
            }
          }
          else if ((uVar4 & 4) != 0) {
            verifyconnect(conn->tempsock[lVar13 + 1],&local_b0);
          }
          iVar2 = local_b0;
          iVar14 = 0;
          iVar15 = 0;
          CVar5 = local_ac;
          CVar7 = local_a4;
          if (local_b0 != 0) {
            (pSVar11->state).os_errno = local_b0;
            piVar9 = __errno_location();
            *piVar9 = iVar2;
            iVar15 = iVar14;
            CVar5 = local_ac;
            CVar7 = local_a4;
            if (conn->tempaddr[lVar13 + 1] != (Curl_addrinfo *)0x0) {
              local_94 = uVar12;
              Curl_printable_address(conn->tempaddr[lVar13 + 1],local_68,0x2e);
              lVar8 = conn->port;
              pcVar10 = Curl_strerror(conn,local_b0);
              Curl_infof(pSVar11,"connect to %s port %ld failed: %s\n",local_68,lVar8,pcVar10);
              conn->timeoutms_per_addr =
                   local_70 >> (conn->tempaddr[lVar13 + 1]->ai_next != (Curl_addrinfo *)0x0);
              CVar6 = trynextip(conn,local_a8,(int)lVar13 + 1);
              pSVar11 = local_78;
              CVar7 = local_a4;
              if ((CVar6 != CURLE_COULDNT_CONNECT) ||
                 (CVar5 = local_ac, conn->tempsock[local_94] == -1)) {
                CVar5 = CVar6;
              }
            }
          }
        }
LAB_004bf43c:
        local_a4 = CVar7;
        local_ac = CVar5;
        if ((iVar15 != 6) && (iVar15 != 0)) {
          return local_a4;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 == 0);
      CVar5 = CURLE_OK;
      if ((local_ac != CURLE_OK) &&
         ((CVar7 = local_ac, conn->tempaddr[1] != (Curl_addrinfo *)0x0 ||
          (CVar7 = trynextip(conn,local_a8,1), CVar7 != CURLE_OK)))) {
        uVar1 = *(undefined8 *)(conn->primary_ip + (ulong)(conn->bits).proxy * 0x20 + -0x3c);
        lVar13 = conn->port;
        pcVar10 = Curl_strerror(conn,local_b0);
        Curl_failf(pSVar11,"Failed to connect to %s port %ld: %s",uVar1,lVar13,pcVar10);
        CVar5 = CVar7;
      }
    }
  }
  return CVar5;
}

Assistant:

CURLcode Curl_is_connected(struct connectdata *conn,
                           int sockindex,
                           bool *connected)
{
  struct SessionHandle *data = conn->data;
  CURLcode result = CURLE_OK;
  long allow;
  int error = 0;
  struct timeval now;
  int rc;
  int i;

  DEBUGASSERT(sockindex >= FIRSTSOCKET && sockindex <= SECONDARYSOCKET);

  *connected = FALSE; /* a very negative world view is best */

  if(conn->bits.tcpconnect[sockindex]) {
    /* we are connected already! */
    *connected = TRUE;
    return CURLE_OK;
  }

  now = Curl_tvnow();

  /* figure out how long time we have left to connect */
  allow = Curl_timeleft(data, &now, TRUE);

  if(allow < 0) {
    /* time-out, bail out, go home */
    failf(data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  for(i=0; i<2; i++) {
    const int other = i ^ 1;
    if(conn->tempsock[i] == CURL_SOCKET_BAD)
      continue;

#ifdef mpeix
    /* Call this function once now, and ignore the results. We do this to
       "clear" the error state on the socket so that we can later read it
       reliably. This is reported necessary on the MPE/iX operating system. */
    (void)verifyconnect(conn->tempsock[i], NULL);
#endif

    /* check socket for connect */
    rc = Curl_socket_ready(CURL_SOCKET_BAD, conn->tempsock[i], 0);

    if(rc == 0) { /* no connection yet */
      if(curlx_tvdiff(now, conn->connecttime) >= conn->timeoutms_per_addr) {
        infof(data, "After %ldms connect time, move on!\n",
              conn->timeoutms_per_addr);
        error = ETIMEDOUT;
      }

      /* should we try another protocol family? */
      if(i == 0 && conn->tempaddr[1] == NULL &&
         curlx_tvdiff(now, conn->connecttime) >= HAPPY_EYEBALLS_TIMEOUT) {
        trynextip(conn, sockindex, 1);
      }
    }
    else if(rc == CURL_CSELECT_OUT) {
      if(verifyconnect(conn->tempsock[i], &error)) {
        /* we are connected with TCP, awesome! */

        /* use this socket from now on */
        conn->sock[sockindex] = conn->tempsock[i];
        conn->ip_addr = conn->tempaddr[i];
        conn->tempsock[i] = CURL_SOCKET_BAD;

        /* close the other socket, if open */
        if(conn->tempsock[other] != CURL_SOCKET_BAD) {
          Curl_closesocket(conn, conn->tempsock[other]);
          conn->tempsock[other] = CURL_SOCKET_BAD;
        }

        /* see if we need to do any proxy magic first once we connected */
        result = Curl_connected_proxy(conn, sockindex);
        if(result)
          return result;

        conn->bits.tcpconnect[sockindex] = TRUE;

        *connected = TRUE;
        if(sockindex == FIRSTSOCKET)
          Curl_pgrsTime(data, TIMER_CONNECT); /* connect done */
        Curl_updateconninfo(conn, conn->sock[sockindex]);
        Curl_verboseconnect(conn);

        return CURLE_OK;
      }
      else
        infof(data, "Connection failed\n");
    }
    else if(rc & CURL_CSELECT_ERR)
      (void)verifyconnect(conn->tempsock[i], &error);

    /*
     * The connection failed here, we should attempt to connect to the "next
     * address" for the given host. But first remember the latest error.
     */
    if(error) {
      data->state.os_errno = error;
      SET_SOCKERRNO(error);
      if(conn->tempaddr[i]) {
        CURLcode status;
        char ipaddress[MAX_IPADR_LEN];
        Curl_printable_address(conn->tempaddr[i], ipaddress, MAX_IPADR_LEN);
        infof(data, "connect to %s port %ld failed: %s\n",
              ipaddress, conn->port, Curl_strerror(conn, error));

        conn->timeoutms_per_addr = conn->tempaddr[i]->ai_next == NULL ?
                                   allow : allow / 2;

        status = trynextip(conn, sockindex, i);
        if(status != CURLE_COULDNT_CONNECT
            || conn->tempsock[other] == CURL_SOCKET_BAD)
          /* the last attempt failed and no other sockets remain open */
          result = status;
      }
    }
  }

  if(result) {
    /* no more addresses to try */

    /* if the first address family runs out of addresses to try before
       the happy eyeball timeout, go ahead and try the next family now */
    if(conn->tempaddr[1] == NULL) {
      result = trynextip(conn, sockindex, 1);
      if(!result)
        return result;
    }

    failf(data, "Failed to connect to %s port %ld: %s",
          conn->bits.proxy?conn->proxy.name:conn->host.name,
          conn->port, Curl_strerror(conn, error));
  }

  return result;
}